

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void aom_filter_block1d16_v4_ssse3
               (uint8_t *src_ptr,ptrdiff_t src_pitch,uint8_t *output_ptr,ptrdiff_t out_pitch,
               uint32_t output_height,int16_t *filter)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 *puVar11;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 (*in_R9) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i resReg23_45_hi;
  __m128i resReg34_56_lo;
  __m128i resReg23_45_lo;
  __m128i resReg56_hi;
  __m128i resReg45_hi;
  __m128i resReg34_hi;
  __m128i resReg23_hi;
  __m128i resReg56_lo;
  __m128i resReg45_lo;
  __m128i resReg34_lo;
  __m128i resReg23_lo;
  __m128i srcReg56_hi;
  __m128i srcReg56_lo;
  __m128i srcReg45_hi;
  __m128i srcReg45_lo;
  __m128i srcReg34_hi;
  __m128i srcReg34_lo;
  __m128i srcReg23_hi;
  __m128i srcReg23_lo;
  __m128i srcReg6;
  __m128i srcReg5;
  __m128i srcReg4;
  __m128i srcReg3;
  __m128i srcReg2;
  __m128i filtersReg;
  uint local_74c;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 *local_540;
  long local_530;
  short local_528;
  short sStack_526;
  short sStack_524;
  short sStack_522;
  short sStack_520;
  short sStack_51e;
  short sStack_51c;
  short sStack_51a;
  short local_518;
  short sStack_516;
  short sStack_514;
  short sStack_512;
  short sStack_510;
  short sStack_50e;
  short sStack_50c;
  short sStack_50a;
  short local_508;
  short sStack_506;
  short sStack_504;
  short sStack_502;
  short sStack_500;
  short sStack_4fe;
  short sStack_4fc;
  short sStack_4fa;
  short local_4f8;
  short sStack_4f6;
  short sStack_4f4;
  short sStack_4f2;
  short sStack_4f0;
  short sStack_4ee;
  short sStack_4ec;
  short sStack_4ea;
  undefined1 local_198;
  undefined1 uStack_197;
  undefined1 uStack_196;
  undefined1 uStack_195;
  undefined1 uStack_194;
  undefined1 uStack_193;
  undefined1 uStack_192;
  undefined1 uStack_191;
  undefined1 local_178;
  undefined1 uStack_177;
  undefined1 uStack_176;
  undefined1 uStack_175;
  undefined1 uStack_174;
  undefined1 uStack_173;
  undefined1 uStack_172;
  undefined1 uStack_171;
  undefined1 local_168;
  undefined1 uStack_167;
  undefined1 uStack_166;
  undefined1 uStack_165;
  undefined1 uStack_164;
  undefined1 uStack_163;
  undefined1 uStack_162;
  undefined1 uStack_161;
  undefined1 local_158;
  undefined1 uStack_157;
  undefined1 uStack_156;
  undefined1 uStack_155;
  undefined1 uStack_154;
  undefined1 uStack_153;
  undefined1 uStack_152;
  undefined1 uStack_151;
  undefined1 local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  undefined1 uStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  undefined1 uStack_127;
  undefined1 uStack_126;
  undefined1 uStack_125;
  undefined1 uStack_124;
  undefined1 uStack_123;
  undefined1 uStack_122;
  undefined1 uStack_121;
  undefined1 uStack_110;
  undefined1 uStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  undefined1 uStack_10c;
  undefined1 uStack_10b;
  undefined1 uStack_10a;
  undefined1 uStack_109;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  undefined1 uStack_e0;
  undefined1 uStack_df;
  undefined1 uStack_de;
  undefined1 uStack_dd;
  undefined1 uStack_dc;
  undefined1 uStack_db;
  undefined1 uStack_da;
  undefined1 uStack_d9;
  undefined1 uStack_d0;
  undefined1 uStack_cf;
  undefined1 uStack_ce;
  undefined1 uStack_cd;
  undefined1 uStack_cc;
  undefined1 uStack_cb;
  undefined1 uStack_ca;
  undefined1 uStack_c9;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  ptrdiff_t dst_stride;
  ptrdiff_t src_stride;
  uint i;
  __m128i thirdFilters;
  __m128i secondFilters;
  __m128i addFilterReg32;
  __m128i resReg34_56;
  __m128i resReg23_45;
  __m128i resReg34_56_hi;
  
  auVar12 = psraw(*in_R9,ZEXT416(1));
  auVar13 = packsswb(auVar12,auVar12);
  auVar14._8_8_ = 0x302030203020302;
  auVar14._0_8_ = 0x302030203020302;
  auVar14 = pshufb(auVar13,auVar14);
  auVar12._8_8_ = 0x504050405040504;
  auVar12._0_8_ = 0x504050405040504;
  auVar12 = pshufb(auVar13,auVar12);
  puVar11 = (undefined8 *)(in_RDI + in_RSI * 2);
  uVar1 = *puVar11;
  uVar2 = puVar11[1];
  puVar11 = (undefined8 *)(in_RDI + in_RSI * 3);
  uVar3 = *puVar11;
  uVar4 = puVar11[1];
  uStack_127 = (undefined1)((ulong)uVar1 >> 8);
  uStack_126 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_125 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_124 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_123 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_122 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_121 = (undefined1)((ulong)uVar1 >> 0x38);
  local_138 = (undefined1)uVar3;
  uStack_137 = (undefined1)((ulong)uVar3 >> 8);
  uStack_136 = (undefined1)((ulong)uVar3 >> 0x10);
  uStack_135 = (undefined1)((ulong)uVar3 >> 0x18);
  uStack_134 = (undefined1)((ulong)uVar3 >> 0x20);
  uStack_133 = (undefined1)((ulong)uVar3 >> 0x28);
  uStack_132 = (undefined1)((ulong)uVar3 >> 0x30);
  uStack_131 = (undefined1)((ulong)uVar3 >> 0x38);
  local_5c8 = CONCAT17(uStack_135,
                       CONCAT16(uStack_125,
                                CONCAT15(uStack_136,
                                         CONCAT14(uStack_126,
                                                  CONCAT13(uStack_137,
                                                           CONCAT12(uStack_127,
                                                                    CONCAT11(local_138,(char)uVar1))
                                                          )))));
  uStack_5c0 = CONCAT17(uStack_131,
                        CONCAT16(uStack_121,
                                 CONCAT15(uStack_132,
                                          CONCAT14(uStack_122,
                                                   CONCAT13(uStack_133,
                                                            CONCAT12(uStack_123,
                                                                     CONCAT11(uStack_134,uStack_124)
                                                                    ))))));
  uStack_9f = (undefined1)((ulong)uVar2 >> 8);
  uStack_9e = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_9d = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_9c = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_9b = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_9a = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_99 = (undefined1)((ulong)uVar2 >> 0x38);
  uStack_b0 = (undefined1)uVar4;
  uStack_af = (undefined1)((ulong)uVar4 >> 8);
  uStack_ae = (undefined1)((ulong)uVar4 >> 0x10);
  uStack_ad = (undefined1)((ulong)uVar4 >> 0x18);
  uStack_ac = (undefined1)((ulong)uVar4 >> 0x20);
  uStack_ab = (undefined1)((ulong)uVar4 >> 0x28);
  uStack_aa = (undefined1)((ulong)uVar4 >> 0x30);
  uStack_a9 = (undefined1)((ulong)uVar4 >> 0x38);
  local_5d8 = CONCAT17(uStack_ad,
                       CONCAT16(uStack_9d,
                                CONCAT15(uStack_ae,
                                         CONCAT14(uStack_9e,
                                                  CONCAT13(uStack_af,
                                                           CONCAT12(uStack_9f,
                                                                    CONCAT11(uStack_b0,(char)uVar2))
                                                          )))));
  uStack_5d0 = CONCAT17(uStack_a9,
                        CONCAT16(uStack_99,
                                 CONCAT15(uStack_aa,
                                          CONCAT14(uStack_9a,
                                                   CONCAT13(uStack_ab,
                                                            CONCAT12(uStack_9b,
                                                                     CONCAT11(uStack_ac,uStack_9c)))
                                                  ))));
  puVar11 = (undefined8 *)(in_RDI + in_RSI * 4);
  local_598 = *puVar11;
  uStack_590 = puVar11[1];
  local_158 = (undefined1)local_598;
  uStack_157 = (undefined1)((ulong)local_598 >> 8);
  uStack_156 = (undefined1)((ulong)local_598 >> 0x10);
  uStack_155 = (undefined1)((ulong)local_598 >> 0x18);
  uStack_154 = (undefined1)((ulong)local_598 >> 0x20);
  uStack_153 = (undefined1)((ulong)local_598 >> 0x28);
  uStack_152 = (undefined1)((ulong)local_598 >> 0x30);
  uStack_151 = (undefined1)((ulong)local_598 >> 0x38);
  local_5e8 = CONCAT17(uStack_155,
                       CONCAT16(uStack_135,
                                CONCAT15(uStack_156,
                                         CONCAT14(uStack_136,
                                                  CONCAT13(uStack_157,
                                                           CONCAT12(uStack_137,
                                                                    CONCAT11(local_158,local_138))))
                                        )));
  uStack_5e0 = CONCAT17(uStack_151,
                        CONCAT16(uStack_131,
                                 CONCAT15(uStack_152,
                                          CONCAT14(uStack_132,
                                                   CONCAT13(uStack_153,
                                                            CONCAT12(uStack_133,
                                                                     CONCAT11(uStack_154,uStack_134)
                                                                    ))))));
  uStack_d0 = (undefined1)uStack_590;
  uStack_cf = (undefined1)((ulong)uStack_590 >> 8);
  uStack_ce = (undefined1)((ulong)uStack_590 >> 0x10);
  uStack_cd = (undefined1)((ulong)uStack_590 >> 0x18);
  uStack_cc = (undefined1)((ulong)uStack_590 >> 0x20);
  uStack_cb = (undefined1)((ulong)uStack_590 >> 0x28);
  uStack_ca = (undefined1)((ulong)uStack_590 >> 0x30);
  uStack_c9 = (undefined1)((ulong)uStack_590 >> 0x38);
  local_5f8 = CONCAT17(uStack_cd,
                       CONCAT16(uStack_ad,
                                CONCAT15(uStack_ce,
                                         CONCAT14(uStack_ae,
                                                  CONCAT13(uStack_cf,
                                                           CONCAT12(uStack_af,
                                                                    CONCAT11(uStack_d0,uStack_b0))))
                                        )));
  uStack_5f0 = CONCAT17(uStack_c9,
                        CONCAT16(uStack_a9,
                                 CONCAT15(uStack_ca,
                                          CONCAT14(uStack_aa,
                                                   CONCAT13(uStack_cb,
                                                            CONCAT12(uStack_ab,
                                                                     CONCAT11(uStack_cc,uStack_ac)))
                                                  ))));
  local_540 = in_RDX;
  local_530 = in_RDI;
  for (local_74c = in_R8D; 1 < local_74c; local_74c = local_74c - 2) {
    puVar11 = (undefined8 *)(local_530 + in_RSI * 5);
    uVar1 = *puVar11;
    uVar2 = puVar11[1];
    local_168 = (undefined1)local_598;
    uStack_167 = (undefined1)((ulong)local_598 >> 8);
    uStack_166 = (undefined1)((ulong)local_598 >> 0x10);
    uStack_165 = (undefined1)((ulong)local_598 >> 0x18);
    uStack_164 = (undefined1)((ulong)local_598 >> 0x20);
    uStack_163 = (undefined1)((ulong)local_598 >> 0x28);
    uStack_162 = (undefined1)((ulong)local_598 >> 0x30);
    uStack_161 = (undefined1)((ulong)local_598 >> 0x38);
    local_178 = (undefined1)uVar1;
    uStack_177 = (undefined1)((ulong)uVar1 >> 8);
    uStack_176 = (undefined1)((ulong)uVar1 >> 0x10);
    uStack_175 = (undefined1)((ulong)uVar1 >> 0x18);
    uStack_174 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_173 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_172 = (undefined1)((ulong)uVar1 >> 0x30);
    uStack_171 = (undefined1)((ulong)uVar1 >> 0x38);
    uStack_e0 = (undefined1)uStack_590;
    uStack_df = (undefined1)((ulong)uStack_590 >> 8);
    uStack_de = (undefined1)((ulong)uStack_590 >> 0x10);
    uStack_dd = (undefined1)((ulong)uStack_590 >> 0x18);
    uStack_dc = (undefined1)((ulong)uStack_590 >> 0x20);
    uStack_db = (undefined1)((ulong)uStack_590 >> 0x28);
    uStack_da = (undefined1)((ulong)uStack_590 >> 0x30);
    uStack_d9 = (undefined1)((ulong)uStack_590 >> 0x38);
    uStack_f0 = (undefined1)uVar2;
    uStack_ef = (undefined1)((ulong)uVar2 >> 8);
    uStack_ee = (undefined1)((ulong)uVar2 >> 0x10);
    uStack_ed = (undefined1)((ulong)uVar2 >> 0x18);
    uStack_ec = (undefined1)((ulong)uVar2 >> 0x20);
    uStack_eb = (undefined1)((ulong)uVar2 >> 0x28);
    uStack_ea = (undefined1)((ulong)uVar2 >> 0x30);
    uStack_e9 = (undefined1)((ulong)uVar2 >> 0x38);
    puVar11 = (undefined8 *)(local_530 + in_RSI * 6);
    local_598 = *puVar11;
    uStack_590 = puVar11[1];
    local_198 = (undefined1)local_598;
    uStack_197 = (undefined1)((ulong)local_598 >> 8);
    uStack_196 = (undefined1)((ulong)local_598 >> 0x10);
    uStack_195 = (undefined1)((ulong)local_598 >> 0x18);
    uStack_194 = (undefined1)((ulong)local_598 >> 0x20);
    uStack_193 = (undefined1)((ulong)local_598 >> 0x28);
    uStack_192 = (undefined1)((ulong)local_598 >> 0x30);
    uStack_191 = (undefined1)((ulong)local_598 >> 0x38);
    uStack_110 = (undefined1)uStack_590;
    uStack_10f = (undefined1)((ulong)uStack_590 >> 8);
    uStack_10e = (undefined1)((ulong)uStack_590 >> 0x10);
    uStack_10d = (undefined1)((ulong)uStack_590 >> 0x18);
    uStack_10c = (undefined1)((ulong)uStack_590 >> 0x20);
    uStack_10b = (undefined1)((ulong)uStack_590 >> 0x28);
    uStack_10a = (undefined1)((ulong)uStack_590 >> 0x30);
    uStack_109 = (undefined1)((ulong)uStack_590 >> 0x38);
    auVar6._8_8_ = uStack_5c0;
    auVar6._0_8_ = local_5c8;
    auVar13 = pmaddubsw(auVar6,auVar14);
    auVar5._8_8_ = uStack_5e0;
    auVar5._0_8_ = local_5e8;
    auVar15 = pmaddubsw(auVar5,auVar14);
    auVar19[1] = local_178;
    auVar19[0] = local_168;
    auVar19[2] = uStack_167;
    auVar19[3] = uStack_177;
    auVar19[4] = uStack_166;
    auVar19[5] = uStack_176;
    auVar19[6] = uStack_165;
    auVar19[7] = uStack_175;
    auVar19[9] = uStack_174;
    auVar19[8] = uStack_164;
    auVar19[10] = uStack_163;
    auVar19[0xb] = uStack_173;
    auVar19[0xc] = uStack_162;
    auVar19[0xd] = uStack_172;
    auVar19[0xe] = uStack_161;
    auVar19[0xf] = uStack_171;
    auVar16 = pmaddubsw(auVar19,auVar12);
    auVar18[1] = local_198;
    auVar18[0] = local_178;
    auVar18[2] = uStack_177;
    auVar18[3] = uStack_197;
    auVar18[4] = uStack_176;
    auVar18[5] = uStack_196;
    auVar18[6] = uStack_175;
    auVar18[7] = uStack_195;
    auVar18[9] = uStack_194;
    auVar18[8] = uStack_174;
    auVar18[10] = uStack_173;
    auVar18[0xb] = uStack_193;
    auVar18[0xc] = uStack_172;
    auVar18[0xd] = uStack_192;
    auVar18[0xe] = uStack_171;
    auVar18[0xf] = uStack_191;
    auVar17 = pmaddubsw(auVar18,auVar12);
    auVar18 = paddsw(auVar13,auVar16);
    auVar19 = paddsw(auVar15,auVar17);
    auVar17._8_8_ = uStack_5d0;
    auVar17._0_8_ = local_5d8;
    auVar17 = pmaddubsw(auVar17,auVar14);
    auVar16._8_8_ = uStack_5f0;
    auVar16._0_8_ = local_5f8;
    auVar16 = pmaddubsw(auVar16,auVar14);
    auVar15[1] = uStack_f0;
    auVar15[0] = uStack_e0;
    auVar15[2] = uStack_df;
    auVar15[3] = uStack_ef;
    auVar15[4] = uStack_de;
    auVar15[5] = uStack_ee;
    auVar15[6] = uStack_dd;
    auVar15[7] = uStack_ed;
    auVar15[9] = uStack_ec;
    auVar15[8] = uStack_dc;
    auVar15[10] = uStack_db;
    auVar15[0xb] = uStack_eb;
    auVar15[0xc] = uStack_da;
    auVar15[0xd] = uStack_ea;
    auVar15[0xe] = uStack_d9;
    auVar15[0xf] = uStack_e9;
    auVar15 = pmaddubsw(auVar15,auVar12);
    auVar13[1] = uStack_110;
    auVar13[0] = uStack_f0;
    auVar13[2] = uStack_ef;
    auVar13[3] = uStack_10f;
    auVar13[4] = uStack_ee;
    auVar13[5] = uStack_10e;
    auVar13[6] = uStack_ed;
    auVar13[7] = uStack_10d;
    auVar13[9] = uStack_10c;
    auVar13[8] = uStack_ec;
    auVar13[10] = uStack_eb;
    auVar13[0xb] = uStack_10b;
    auVar13[0xc] = uStack_ea;
    auVar13[0xd] = uStack_10a;
    auVar13[0xe] = uStack_e9;
    auVar13[0xf] = uStack_109;
    auVar13 = pmaddubsw(auVar13,auVar12);
    auVar15 = paddsw(auVar17,auVar15);
    auVar13 = paddsw(auVar16,auVar13);
    auVar10._8_8_ = 0x20002000200020;
    auVar10._0_8_ = 0x20002000200020;
    auVar16 = paddsw(auVar18,auVar10);
    auVar9._8_8_ = 0x20002000200020;
    auVar9._0_8_ = 0x20002000200020;
    auVar17 = paddsw(auVar19,auVar9);
    auVar8._8_8_ = 0x20002000200020;
    auVar8._0_8_ = 0x20002000200020;
    auVar15 = paddsw(auVar15,auVar8);
    auVar7._8_8_ = 0x20002000200020;
    auVar7._0_8_ = 0x20002000200020;
    auVar13 = paddsw(auVar13,auVar7);
    auVar16 = psraw(auVar16,ZEXT416(6));
    auVar17 = psraw(auVar17,ZEXT416(6));
    auVar15 = psraw(auVar15,ZEXT416(6));
    auVar13 = psraw(auVar13,ZEXT416(6));
    local_4f8 = auVar16._0_2_;
    sStack_4f6 = auVar16._2_2_;
    sStack_4f4 = auVar16._4_2_;
    sStack_4f2 = auVar16._6_2_;
    sStack_4f0 = auVar16._8_2_;
    sStack_4ee = auVar16._10_2_;
    sStack_4ec = auVar16._12_2_;
    sStack_4ea = auVar16._14_2_;
    local_508 = auVar15._0_2_;
    sStack_506 = auVar15._2_2_;
    sStack_504 = auVar15._4_2_;
    sStack_502 = auVar15._6_2_;
    sStack_500 = auVar15._8_2_;
    sStack_4fe = auVar15._10_2_;
    sStack_4fc = auVar15._12_2_;
    sStack_4fa = auVar15._14_2_;
    local_518 = auVar17._0_2_;
    sStack_516 = auVar17._2_2_;
    sStack_514 = auVar17._4_2_;
    sStack_512 = auVar17._6_2_;
    sStack_510 = auVar17._8_2_;
    sStack_50e = auVar17._10_2_;
    sStack_50c = auVar17._12_2_;
    sStack_50a = auVar17._14_2_;
    local_528 = auVar13._0_2_;
    sStack_526 = auVar13._2_2_;
    sStack_524 = auVar13._4_2_;
    sStack_522 = auVar13._6_2_;
    sStack_520 = auVar13._8_2_;
    sStack_51e = auVar13._10_2_;
    sStack_51c = auVar13._12_2_;
    sStack_51a = auVar13._14_2_;
    local_530 = in_RSI * 2 + local_530;
    *local_540 = CONCAT17((0 < sStack_4ea) * (sStack_4ea < 0x100) * auVar16[0xe] -
                          (0xff < sStack_4ea),
                          CONCAT16((0 < sStack_4ec) * (sStack_4ec < 0x100) * auVar16[0xc] -
                                   (0xff < sStack_4ec),
                                   CONCAT15((0 < sStack_4ee) * (sStack_4ee < 0x100) * auVar16[10] -
                                            (0xff < sStack_4ee),
                                            CONCAT14((0 < sStack_4f0) * (sStack_4f0 < 0x100) *
                                                     auVar16[8] - (0xff < sStack_4f0),
                                                     CONCAT13((0 < sStack_4f2) *
                                                              (sStack_4f2 < 0x100) * auVar16[6] -
                                                              (0xff < sStack_4f2),
                                                              CONCAT12((0 < sStack_4f4) *
                                                                       (sStack_4f4 < 0x100) *
                                                                       auVar16[4] -
                                                                       (0xff < sStack_4f4),
                                                                       CONCAT11((0 < sStack_4f6) *
                                                                                (sStack_4f6 < 0x100)
                                                                                * auVar16[2] -
                                                                                (0xff < sStack_4f6),
                                                                                (0 < local_4f8) *
                                                                                (local_4f8 < 0x100)
                                                                                * auVar16[0] -
                                                                                (0xff < local_4f8)))
                                                             )))));
    local_540[1] = CONCAT17((0 < sStack_4fa) * (sStack_4fa < 0x100) * auVar15[0xe] -
                            (0xff < sStack_4fa),
                            CONCAT16((0 < sStack_4fc) * (sStack_4fc < 0x100) * auVar15[0xc] -
                                     (0xff < sStack_4fc),
                                     CONCAT15((0 < sStack_4fe) * (sStack_4fe < 0x100) * auVar15[10]
                                              - (0xff < sStack_4fe),
                                              CONCAT14((0 < sStack_500) * (sStack_500 < 0x100) *
                                                       auVar15[8] - (0xff < sStack_500),
                                                       CONCAT13((0 < sStack_502) *
                                                                (sStack_502 < 0x100) * auVar15[6] -
                                                                (0xff < sStack_502),
                                                                CONCAT12((0 < sStack_504) *
                                                                         (sStack_504 < 0x100) *
                                                                         auVar15[4] -
                                                                         (0xff < sStack_504),
                                                                         CONCAT11((0 < sStack_506) *
                                                                                  (sStack_506 <
                                                                                  0x100) * auVar15[2
                                                  ] - (0xff < sStack_506),
                                                  (0 < local_508) * (local_508 < 0x100) * auVar15[0]
                                                  - (0xff < local_508))))))));
    *(undefined8 *)((long)local_540 + in_RCX) =
         CONCAT17((0 < sStack_50a) * (sStack_50a < 0x100) * auVar17[0xe] - (0xff < sStack_50a),
                  CONCAT16((0 < sStack_50c) * (sStack_50c < 0x100) * auVar17[0xc] -
                           (0xff < sStack_50c),
                           CONCAT15((0 < sStack_50e) * (sStack_50e < 0x100) * auVar17[10] -
                                    (0xff < sStack_50e),
                                    CONCAT14((0 < sStack_510) * (sStack_510 < 0x100) * auVar17[8] -
                                             (0xff < sStack_510),
                                             CONCAT13((0 < sStack_512) * (sStack_512 < 0x100) *
                                                      auVar17[6] - (0xff < sStack_512),
                                                      CONCAT12((0 < sStack_514) *
                                                               (sStack_514 < 0x100) * auVar17[4] -
                                                               (0xff < sStack_514),
                                                               CONCAT11((0 < sStack_516) *
                                                                        (sStack_516 < 0x100) *
                                                                        auVar17[2] -
                                                                        (0xff < sStack_516),
                                                                        (0 < local_518) *
                                                                        (local_518 < 0x100) *
                                                                        auVar17[0] -
                                                                        (0xff < local_518))))))));
    ((undefined8 *)((long)local_540 + in_RCX))[1] =
         CONCAT17((0 < sStack_51a) * (sStack_51a < 0x100) * auVar13[0xe] - (0xff < sStack_51a),
                  CONCAT16((0 < sStack_51c) * (sStack_51c < 0x100) * auVar13[0xc] -
                           (0xff < sStack_51c),
                           CONCAT15((0 < sStack_51e) * (sStack_51e < 0x100) * auVar13[10] -
                                    (0xff < sStack_51e),
                                    CONCAT14((0 < sStack_520) * (sStack_520 < 0x100) * auVar13[8] -
                                             (0xff < sStack_520),
                                             CONCAT13((0 < sStack_522) * (sStack_522 < 0x100) *
                                                      auVar13[6] - (0xff < sStack_522),
                                                      CONCAT12((0 < sStack_524) *
                                                               (sStack_524 < 0x100) * auVar13[4] -
                                                               (0xff < sStack_524),
                                                               CONCAT11((0 < sStack_526) *
                                                                        (sStack_526 < 0x100) *
                                                                        auVar13[2] -
                                                                        (0xff < sStack_526),
                                                                        (0 < local_528) *
                                                                        (local_528 < 0x100) *
                                                                        auVar13[0] -
                                                                        (0xff < local_528))))))));
    local_540 = (undefined8 *)(in_RCX * 2 + (long)local_540);
    local_5c8 = CONCAT17(uStack_175,
                         CONCAT16(uStack_165,
                                  CONCAT15(uStack_176,
                                           CONCAT14(uStack_166,
                                                    CONCAT13(uStack_177,
                                                             CONCAT12(uStack_167,
                                                                      CONCAT11(local_178,local_168))
                                                            )))));
    uStack_5c0 = CONCAT17(uStack_171,
                          CONCAT16(uStack_161,
                                   CONCAT15(uStack_172,
                                            CONCAT14(uStack_162,
                                                     CONCAT13(uStack_173,
                                                              CONCAT12(uStack_163,
                                                                       CONCAT11(uStack_174,
                                                                                uStack_164)))))));
    local_5e8 = CONCAT17(uStack_195,
                         CONCAT16(uStack_175,
                                  CONCAT15(uStack_196,
                                           CONCAT14(uStack_176,
                                                    CONCAT13(uStack_197,
                                                             CONCAT12(uStack_177,
                                                                      CONCAT11(local_198,local_178))
                                                            )))));
    uStack_5e0 = CONCAT17(uStack_191,
                          CONCAT16(uStack_171,
                                   CONCAT15(uStack_192,
                                            CONCAT14(uStack_172,
                                                     CONCAT13(uStack_193,
                                                              CONCAT12(uStack_173,
                                                                       CONCAT11(uStack_194,
                                                                                uStack_174)))))));
    local_5d8 = CONCAT17(uStack_ed,
                         CONCAT16(uStack_dd,
                                  CONCAT15(uStack_ee,
                                           CONCAT14(uStack_de,
                                                    CONCAT13(uStack_ef,
                                                             CONCAT12(uStack_df,
                                                                      CONCAT11(uStack_f0,uStack_e0))
                                                            )))));
    uStack_5d0 = CONCAT17(uStack_e9,
                          CONCAT16(uStack_d9,
                                   CONCAT15(uStack_ea,
                                            CONCAT14(uStack_da,
                                                     CONCAT13(uStack_eb,
                                                              CONCAT12(uStack_db,
                                                                       CONCAT11(uStack_ec,uStack_dc)
                                                                      ))))));
    local_5f8 = CONCAT17(uStack_10d,
                         CONCAT16(uStack_ed,
                                  CONCAT15(uStack_10e,
                                           CONCAT14(uStack_ee,
                                                    CONCAT13(uStack_10f,
                                                             CONCAT12(uStack_ef,
                                                                      CONCAT11(uStack_110,uStack_f0)
                                                                     ))))));
    uStack_5f0 = CONCAT17(uStack_109,
                          CONCAT16(uStack_e9,
                                   CONCAT15(uStack_10a,
                                            CONCAT14(uStack_ea,
                                                     CONCAT13(uStack_10b,
                                                              CONCAT12(uStack_eb,
                                                                       CONCAT11(uStack_10c,uStack_ec
                                                                               )))))));
  }
  return;
}

Assistant:

static void aom_filter_block1d16_v4_ssse3(
    const uint8_t *src_ptr, ptrdiff_t src_pitch, uint8_t *output_ptr,
    ptrdiff_t out_pitch, uint32_t output_height, const int16_t *filter) {
  __m128i filtersReg;
  __m128i srcReg2, srcReg3, srcReg4, srcReg5, srcReg6;
  __m128i srcReg23_lo, srcReg23_hi, srcReg34_lo, srcReg34_hi;
  __m128i srcReg45_lo, srcReg45_hi, srcReg56_lo, srcReg56_hi;
  __m128i resReg23_lo, resReg34_lo, resReg45_lo, resReg56_lo;
  __m128i resReg23_hi, resReg34_hi, resReg45_hi, resReg56_hi;
  __m128i resReg23_45_lo, resReg34_56_lo, resReg23_45_hi, resReg34_56_hi;
  __m128i resReg23_45, resReg34_56;
  __m128i addFilterReg32, secondFilters, thirdFilters;
  unsigned int i;
  ptrdiff_t src_stride, dst_stride;

  addFilterReg32 = _mm_set1_epi16(32);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  // converting the 16 bit (short) to  8 bit (byte) and have the
  // same data in both lanes of 128 bit register.
  filtersReg = _mm_srai_epi16(filtersReg, 1);
  filtersReg = _mm_packs_epi16(filtersReg, filtersReg);

  // duplicate only the second 16 bits (third and forth byte)
  // across 128 bit register
  secondFilters = _mm_shuffle_epi8(filtersReg, _mm_set1_epi16(0x302u));
  // duplicate only the third 16 bits (fifth and sixth byte)
  // across 128 bit register
  thirdFilters = _mm_shuffle_epi8(filtersReg, _mm_set1_epi16(0x504u));

  // multiple the size of the source and destination stride by two
  src_stride = src_pitch << 1;
  dst_stride = out_pitch << 1;

  srcReg2 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 2));
  srcReg3 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 3));
  srcReg23_lo = _mm_unpacklo_epi8(srcReg2, srcReg3);
  srcReg23_hi = _mm_unpackhi_epi8(srcReg2, srcReg3);

  srcReg4 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 4));

  // have consecutive loads on the same 256 register
  srcReg34_lo = _mm_unpacklo_epi8(srcReg3, srcReg4);
  srcReg34_hi = _mm_unpackhi_epi8(srcReg3, srcReg4);

  for (i = output_height; i > 1; i -= 2) {
    srcReg5 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 5));

    srcReg45_lo = _mm_unpacklo_epi8(srcReg4, srcReg5);
    srcReg45_hi = _mm_unpackhi_epi8(srcReg4, srcReg5);

    srcReg6 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 6));

    srcReg56_lo = _mm_unpacklo_epi8(srcReg5, srcReg6);
    srcReg56_hi = _mm_unpackhi_epi8(srcReg5, srcReg6);

    // multiply 2 adjacent elements with the filter and add the result
    resReg23_lo = _mm_maddubs_epi16(srcReg23_lo, secondFilters);
    resReg34_lo = _mm_maddubs_epi16(srcReg34_lo, secondFilters);
    resReg45_lo = _mm_maddubs_epi16(srcReg45_lo, thirdFilters);
    resReg56_lo = _mm_maddubs_epi16(srcReg56_lo, thirdFilters);

    // add and saturate the results together
    resReg23_45_lo = _mm_adds_epi16(resReg23_lo, resReg45_lo);
    resReg34_56_lo = _mm_adds_epi16(resReg34_lo, resReg56_lo);

    // multiply 2 adjacent elements with the filter and add the result

    resReg23_hi = _mm_maddubs_epi16(srcReg23_hi, secondFilters);
    resReg34_hi = _mm_maddubs_epi16(srcReg34_hi, secondFilters);
    resReg45_hi = _mm_maddubs_epi16(srcReg45_hi, thirdFilters);
    resReg56_hi = _mm_maddubs_epi16(srcReg56_hi, thirdFilters);

    // add and saturate the results together
    resReg23_45_hi = _mm_adds_epi16(resReg23_hi, resReg45_hi);
    resReg34_56_hi = _mm_adds_epi16(resReg34_hi, resReg56_hi);

    // shift by 6 bit each 16 bit
    resReg23_45_lo = _mm_adds_epi16(resReg23_45_lo, addFilterReg32);
    resReg34_56_lo = _mm_adds_epi16(resReg34_56_lo, addFilterReg32);
    resReg23_45_hi = _mm_adds_epi16(resReg23_45_hi, addFilterReg32);
    resReg34_56_hi = _mm_adds_epi16(resReg34_56_hi, addFilterReg32);
    resReg23_45_lo = _mm_srai_epi16(resReg23_45_lo, 6);
    resReg34_56_lo = _mm_srai_epi16(resReg34_56_lo, 6);
    resReg23_45_hi = _mm_srai_epi16(resReg23_45_hi, 6);
    resReg34_56_hi = _mm_srai_epi16(resReg34_56_hi, 6);

    // shrink to 8 bit each 16 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve
    // result
    resReg23_45 = _mm_packus_epi16(resReg23_45_lo, resReg23_45_hi);
    resReg34_56 = _mm_packus_epi16(resReg34_56_lo, resReg34_56_hi);

    src_ptr += src_stride;

    _mm_store_si128((__m128i *)output_ptr, (resReg23_45));
    _mm_store_si128((__m128i *)(output_ptr + out_pitch), (resReg34_56));

    output_ptr += dst_stride;

    // save part of the registers for next strides
    srcReg23_lo = srcReg45_lo;
    srcReg34_lo = srcReg56_lo;
    srcReg23_hi = srcReg45_hi;
    srcReg34_hi = srcReg56_hi;
    srcReg4 = srcReg6;
  }
}